

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constructor.cpp
# Opt level: O0

void __thiscall cppgenerate::Constructor::Constructor(Constructor *this)

{
  Constructor *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::list<cppgenerate::Argument,_std::allocator<cppgenerate::Argument>_>::list
            (&this->m_arguments);
  CodeBlock::CodeBlock(&this->m_code);
  this->m_accessModifier = PUBLIC;
  return;
}

Assistant:

Constructor::Constructor() :
    m_accessModifier( AccessModifier::PUBLIC ) {
}